

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_57051::StatTest::~StatTest(StatTest *this)

{
  code *pcVar1;
  StatTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

StatTest() : scan_(&state_, NULL, NULL, this, NULL) {}